

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O2

opj_bool opj_jp2_encode(opj_jp2_t *jp2,opj_cio_t *cio,opj_image_t *image,
                       opj_codestream_info_t *cstr_info)

{
  opj_j2k_t *j2k;
  int iVar1;
  int iVar2;
  uint uVar3;
  opj_bool oVar4;
  int iVar5;
  int iVar6;
  int pos;
  int pos_00;
  long lVar7;
  double *pdVar8;
  ulong uVar9;
  uint j2klen;
  byte bVar10;
  opj_codestream_info_t in_stack_ffffffffffffff38;
  int local_44;
  
  bVar10 = 0;
  iVar1 = cio_tell(cio);
  cio_skip(cio,4);
  cio_write(cio,0x6a502020,4);
  cio_write(cio,0xd0a870a,4);
  iVar2 = cio_tell(cio);
  cio_seek(cio,iVar1);
  cio_write(cio,(ulong)(uint)(iVar2 - iVar1),4);
  cio_seek(cio,iVar2);
  iVar1 = cio_tell(cio);
  cio_skip(cio,4);
  cio_write(cio,0x66747970,4);
  cio_write(cio,(ulong)jp2->brand,4);
  cio_write(cio,(ulong)jp2->minversion,4);
  for (uVar9 = 0; uVar9 < jp2->numcl; uVar9 = uVar9 + 1) {
    cio_write(cio,(ulong)jp2->cl[uVar9],4);
  }
  iVar2 = cio_tell(cio);
  cio_seek(cio,iVar1);
  cio_write(cio,(ulong)(uint)(iVar2 - iVar1),4);
  cio_seek(cio,iVar2);
  jp2_write_jp2h(jp2,cio);
  jp2_write_xml(jp2,cio);
  if (jp2->jpip_on == 0) {
    iVar1 = -1;
    local_44 = -1;
  }
  else {
    local_44 = cio_tell(cio);
    cio_skip(cio,0x18);
    iVar1 = cio_tell(cio);
  }
  j2k = jp2->j2k;
  iVar2 = cio_tell(cio);
  cio_skip(cio,4);
  cio_write(cio,0x6a703263,4);
  uVar3 = cio_tell(cio);
  oVar4 = j2k_encode(j2k,cio,image,cstr_info);
  if (oVar4 == 0) {
    opj_event_msg(j2k->cinfo,1,"Failed to encode image\n");
  }
  else {
    iVar5 = cio_tell(cio);
    j2klen = iVar5 - uVar3;
    jp2->j2k_codestream_offset = uVar3;
    jp2->j2k_codestream_length = j2klen;
    uVar3 = j2klen + 8;
    cio_seek(cio,iVar2);
    cio_write(cio,(ulong)uVar3,4);
    cio_seek(cio,j2klen + iVar2 + 8);
    if (uVar3 != 0) {
      if (jp2->jpip_on != 0) {
        iVar2 = cio_tell(cio);
        pdVar8 = (double *)&stack0xffffffffffffff38;
        for (lVar7 = 0xe; lVar7 != 0; lVar7 = lVar7 + -1) {
          *pdVar8 = cstr_info->D_max;
          cstr_info = (opj_codestream_info_t *)((long)cstr_info + (ulong)bVar10 * -0x10 + 8);
          pdVar8 = pdVar8 + (ulong)bVar10 * -2 + 1;
        }
        iVar5 = write_cidx(iVar1 + 8,cio,image,in_stack_ffffffffffffff38,j2klen);
        iVar6 = cio_tell(cio);
        pos = cio_tell(cio);
        cio_skip(cio,4);
        cio_write(cio,0x66696478,4);
        pos_00 = cio_tell(cio);
        cio_skip(cio,4);
        cio_write(cio,0x70727879,4);
        cio_write(cio,(long)iVar1,8);
        cio_write(cio,(long)(int)uVar3,4);
        cio_write(cio,0x6a703263,4);
        cio_write(cio,1,1);
        cio_write(cio,(long)iVar2,8);
        cio_write(cio,(long)iVar5,4);
        cio_write(cio,0x63696478,4);
        iVar1 = cio_tell(cio);
        cio_seek(cio,pos_00);
        cio_write(cio,(long)(iVar1 - pos_00),4);
        cio_seek(cio,iVar1);
        iVar1 = cio_tell(cio);
        cio_seek(cio,pos);
        cio_write(cio,(long)(iVar1 - pos),4);
        cio_seek(cio,iVar1);
        iVar2 = cio_tell(cio);
        cio_seek(cio,local_44);
        iVar5 = cio_tell(cio);
        cio_skip(cio,4);
        cio_write(cio,0x69707472,4);
        cio_write(cio,(long)iVar6,8);
        cio_write(cio,(long)(iVar1 - pos),8);
        iVar1 = cio_tell(cio);
        cio_seek(cio,iVar5);
        cio_write(cio,(long)(iVar1 - iVar5),4);
        cio_seek(cio,iVar1);
        cio_seek(cio,iVar2);
        return 1;
      }
      return 1;
    }
  }
  opj_event_msg(jp2->cinfo,1,"Failed to encode image\n");
  return 0;
}

Assistant:

opj_bool opj_jp2_encode(opj_jp2_t *jp2, opj_cio_t *cio, opj_image_t *image, opj_codestream_info_t *cstr_info) {

	int pos_iptr, pos_cidx, pos_jp2c, len_jp2c, len_cidx, end_pos, pos_fidx, len_fidx;
	pos_jp2c = pos_iptr = -1; /* remove a warning */

	/* JP2 encoding */

	/* JPEG 2000 Signature box */
	jp2_write_jp(cio);
	/* File Type box */
	jp2_write_ftyp(jp2, cio);
	/* JP2 Header box */
	jp2_write_jp2h(jp2, cio);
	jp2_write_xml(jp2, cio);

	if( jp2->jpip_on){
	  pos_iptr = cio_tell( cio);
	  cio_skip( cio, 24); /* IPTR further ! */
	  
	  pos_jp2c = cio_tell( cio);
	}

	/* J2K encoding */
	if(!(len_jp2c = jp2_write_jp2c( jp2, cio, image, cstr_info))){
	    opj_event_msg(jp2->cinfo, EVT_ERROR, "Failed to encode image\n");
	    return OPJ_FALSE;
	}

	if( jp2->jpip_on){
	  pos_cidx = cio_tell( cio);
	  
	  len_cidx = write_cidx( pos_jp2c+8, cio, image, *cstr_info, len_jp2c-8);
	  
	  pos_fidx = cio_tell( cio);
	  len_fidx = write_fidx( pos_jp2c, len_jp2c, pos_cidx, len_cidx, cio);
	  
	  end_pos = cio_tell( cio);
	  
	  cio_seek( cio, pos_iptr);
	  write_iptr( pos_fidx, len_fidx, cio);
	  	  cio_seek( cio, end_pos);
	}

	return OPJ_TRUE;
}